

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

bool __thiscall
despot::option::Parser::StoreOptionAction::finished(StoreOptionAction *this,int numargs,char **args)

{
  Parser *pPVar1;
  
  if (0 < numargs) {
    pPVar1 = this->parser;
    pPVar1->nonop_count = numargs;
    pPVar1->nonop_args = args;
  }
  return true;
}

Assistant:

bool finished(int numargs, const char** args) {
		// only overwrite non-option argument list if there's at least 1
		// new non-option argument. Otherwise we keep the old list. This
		// makes it easy to use default non-option arguments.
		if (numargs > 0) {
			parser.nonop_count = numargs;
			parser.nonop_args = args;
		}

		return true;
	}